

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O1

LispPTR cdr(LispPTR datum)

{
  uint uVar1;
  uint uVar2;
  
  do {
    uVar2 = datum;
    if (uVar2 == 0) {
      return 0;
    }
    if ((*(ushort *)((ulong)(uVar2 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 5) {
      error("cdr : ARG not list");
    }
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
    datum = *(LispPTR *)(Lisp_world + uVar2);
    uVar1 = datum >> 0x1c;
    if (uVar1 == 8) {
      return 0;
    }
    if ((int)datum < 0) {
      return uVar2 + (uVar1 & 7) * 2;
    }
  } while (datum < 0x10000000);
  uVar1 = uVar2 + uVar1 * 2;
  if ((uVar2 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar1);
  }
  return *(uint *)(Lisp_world + uVar1) & 0xfffffff;
}

Assistant:

LispPTR cdr(LispPTR datum)
/* datum must be LISP pointer(word offset) */
{
  ConsCell *datum68k;
  DLword cdr_code;
  ConsCell *temp;

  if (datum == NIL_PTR) return (NIL_PTR);
  if (!Listp(datum)) error("cdr : ARG not list");

  datum68k = (ConsCell *)(NativeAligned4FromLAddr(datum));
  cdr_code = datum68k->cdr_code;

  if (cdr_code == CDR_NIL) return (NIL_PTR); /* cdr is nil */
  if ((cdr_code & CDR_ONPAGE) != 0) /* cdr-samepage */
#ifdef NEWCDRCODING
    return (datum + ((cdr_code & 7) << 1));
#else
    return (POINTER_PAGEBASE(datum) + ((cdr_code & 127) << 1));
#endif                                 /* NEWCDRCODING */
  if (cdr_code == CDR_INDIRECT) /* cdr_code > CDR_ONPAGE cdr-indirect */
    return (cdr((LispPTR)(datum68k->car_field)));
  /* cdr isn't a CONS, but is stored on this page. */
#ifdef NEWCDRCODING
  temp = (ConsCell *)(NativeAligned4FromLAddr(datum + (cdr_code << 1)));
#else
  temp = (ConsCell *)(NativeAligned4FromLAddr(POINTER_PAGEBASE(datum) + (cdr_code << 1)));
#endif /* NEWCDRCODING */
  return ((LispPTR)temp->car_field);
}